

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm.cpp
# Opt level: O0

int __thiscall
ncnn::LSTM::forward(LSTM *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
                   vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  long *plVar1;
  int iVar2;
  size_type sVar3;
  const_reference pvVar4;
  void *__src;
  void *__dest;
  reference pvVar5;
  Allocator *in_RCX;
  int *piVar6;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  Mat *hidden_state;
  long in_RDI;
  void *in_R8;
  bool bVar7;
  float *ptr_2;
  float *pr;
  float *pf;
  int i_2;
  int ret1;
  Mat cell1;
  Mat hidden1;
  int ret0;
  Mat cell0;
  Mat hidden0;
  Mat top_blob_reverse;
  Mat top_blob_forward;
  int ret;
  Mat *top_blob;
  Allocator *hidden_cell_allocator;
  Mat cell;
  Mat hidden;
  int num_directions;
  int T;
  Mat *bottom_blob;
  int i_1;
  float *ptr_1;
  int size_1;
  int i;
  float *ptr;
  int size;
  Mat *m_8;
  Mat *m_7;
  Mat *m_6;
  Mat *m_5;
  Mat *m_4;
  Mat *m_3;
  Mat *m_2;
  Mat *m_1;
  Mat *m;
  Allocator *in_stack_ffffffffffffea48;
  size_t in_stack_ffffffffffffea50;
  int in_stack_ffffffffffffea58;
  int in_stack_ffffffffffffea5c;
  Mat *in_stack_ffffffffffffea60;
  bool local_13a9;
  undefined7 in_stack_ffffffffffffec70;
  undefined1 in_stack_ffffffffffffec77;
  undefined1 uVar8;
  Mat *in_stack_ffffffffffffec78;
  Mat *bias_c;
  Mat *in_stack_ffffffffffffec80;
  int in_stack_ffffffffffffec8c;
  Mat *in_stack_ffffffffffffec90;
  Mat *in_stack_ffffffffffffec98;
  bool local_12c2;
  bool local_12b1;
  _func_int **local_1270;
  int local_1234;
  void *local_1230;
  int *local_1228;
  ulong local_1220;
  undefined4 local_1218;
  long *local_1210;
  int local_1208;
  int local_1204;
  int local_1200;
  undefined4 local_11fc;
  undefined4 local_11f8;
  ulong local_11f0;
  void *local_11e8;
  int *local_11e0;
  ulong local_11d8;
  undefined4 local_11d0;
  long *local_11c8;
  int local_11c0;
  int local_11bc;
  int local_11b8;
  undefined4 local_11b4;
  undefined4 local_11b0;
  ulong local_11a8;
  Mat *in_stack_ffffffffffffee60;
  Mat *in_stack_ffffffffffffee68;
  Option *in_stack_ffffffffffffee70;
  undefined4 *local_1150;
  int *local_1148;
  size_t local_1140;
  int local_1138;
  Allocator *local_1130;
  undefined4 local_1128;
  int local_1124;
  undefined4 local_1120;
  undefined4 local_111c;
  undefined4 local_1118;
  long local_1110;
  undefined4 *local_1108;
  int *local_1100;
  size_t local_10f8;
  int local_10f0;
  Allocator *local_10e8;
  undefined4 local_10e0;
  int local_10dc;
  undefined4 local_10d8;
  undefined4 local_10d4;
  undefined4 local_10d0;
  long local_10c8;
  void *local_10c0;
  int *local_10b8;
  ulong local_10b0;
  undefined4 local_10a8;
  long *local_10a0;
  int local_1098;
  int local_1094;
  int local_1090;
  undefined4 local_108c;
  undefined4 local_1088;
  ulong local_1080;
  void *local_1078;
  int *local_1070;
  ulong local_1068;
  undefined4 local_1060;
  long *local_1058;
  int local_1050;
  int local_104c;
  int local_1048;
  undefined4 local_1044;
  undefined4 local_1040;
  ulong local_1038;
  void *local_1030;
  int *local_1028;
  ulong local_1020;
  undefined4 local_1018;
  long *local_1010;
  int local_1008;
  int local_1004;
  int local_1000;
  undefined4 local_ffc;
  undefined4 local_ff8;
  ulong local_ff0;
  int local_fe4;
  undefined4 *local_fe0;
  int *local_fd8;
  size_t local_fd0;
  int local_fc8;
  Allocator *local_fc0;
  undefined4 local_fb8;
  int local_fb4;
  undefined4 local_fb0;
  undefined4 local_fac;
  undefined4 local_fa8;
  long local_fa0;
  undefined4 *local_f98;
  int *local_f90;
  size_t local_f88;
  int local_f80;
  Allocator *local_f78;
  undefined4 local_f70;
  int local_f6c;
  undefined4 local_f68;
  undefined4 local_f64;
  undefined4 local_f60;
  long local_f58;
  void *local_f50;
  int *local_f48;
  long local_f40;
  undefined4 local_f38;
  long *local_f30;
  undefined4 local_f28;
  int local_f24;
  undefined4 local_f20;
  undefined4 local_f1c;
  int local_f18;
  long local_f10;
  Mat local_f08;
  void *local_ec0;
  int *local_eb8;
  ulong local_eb0;
  undefined4 local_ea8;
  long *local_ea0;
  int local_e98;
  int local_e94;
  int local_e90;
  undefined4 local_e8c;
  undefined4 local_e88;
  ulong local_e80;
  void *local_e78;
  int *local_e70;
  ulong local_e68;
  undefined4 local_e60;
  long *local_e58;
  int local_e50;
  int local_e4c;
  int local_e48;
  undefined4 local_e44;
  undefined4 local_e40;
  ulong local_e38;
  Mat local_e30;
  int local_de4;
  reference local_de0;
  int local_dd4;
  Mat local_dd0;
  Mat local_d88;
  _func_int **local_d40;
  value_type local_d28;
  value_type local_ce0;
  undefined4 local_c98;
  int local_c94;
  const_reference local_c90;
  Allocator *local_c88;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_c80;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_c78;
  int local_c64;
  value_type *local_c60;
  value_type *local_c58;
  Mat *local_c50;
  Mat *local_c40;
  void **local_c30;
  void **local_c20;
  Mat *local_c10;
  void **local_c00;
  void **local_bf0;
  void **local_be0;
  void **local_bd0;
  void **local_bc0;
  undefined1 *local_bb0;
  undefined4 **local_ba0;
  undefined4 **local_b90;
  undefined4 **local_b80;
  undefined4 **local_b70;
  void **local_b60;
  Mat *local_b50;
  value_type *local_b40;
  value_type *local_b30;
  int local_b20;
  undefined4 local_b1c;
  reference local_b18;
  reference local_b10;
  reference local_b08;
  int local_b00;
  undefined4 local_afc;
  reference local_af8;
  reference local_af0;
  reference local_ae8;
  int local_ae0;
  undefined4 local_adc;
  value_type *local_ad8;
  value_type *local_ad0;
  value_type *local_ac8;
  int local_ac0;
  undefined4 local_abc;
  value_type *local_ab8;
  value_type *local_ab0;
  value_type *local_aa8;
  void **local_aa0;
  Mat *local_a98;
  reference local_a90;
  value_type *local_a88;
  value_type *local_a80;
  int local_a74;
  undefined4 *local_a70;
  int local_a68;
  undefined4 local_a64;
  value_type *local_a60;
  int local_a54;
  undefined4 *local_a50;
  int local_a48;
  undefined4 local_a44;
  value_type *local_a40;
  undefined1 local_a35;
  undefined4 local_a34;
  long *local_a30;
  void **local_a28;
  undefined1 local_a15;
  undefined4 local_a14;
  long *local_a10;
  void **local_a08;
  undefined1 local_9f5;
  undefined4 local_9f4;
  long *local_9f0;
  undefined1 *local_9e8;
  undefined1 local_9d5;
  undefined4 local_9d4;
  undefined8 *local_9d0;
  void **local_9c8;
  undefined1 local_9b5;
  undefined4 local_9b4;
  undefined8 *local_9b0;
  void **local_9a8;
  undefined1 local_995;
  undefined4 local_994;
  undefined8 *local_990;
  void **local_988;
  undefined1 local_975;
  undefined4 local_974;
  undefined8 *local_970;
  void **local_968;
  undefined1 local_955;
  undefined4 local_954;
  undefined8 *local_950;
  void **local_948;
  undefined1 local_935;
  undefined4 local_934;
  undefined8 *local_930;
  Mat *local_928;
  _func_int **local_918;
  undefined8 local_910;
  int local_908;
  undefined4 local_904;
  Mat *local_900;
  _func_int **local_8f8;
  undefined8 local_8f0;
  int local_8e8;
  undefined4 local_8e4;
  void **local_8e0;
  int local_8d4;
  reference local_8d0;
  int local_8c4;
  void **local_8c0;
  int local_8b4;
  Mat *local_8b0;
  undefined4 local_8a8;
  undefined4 local_8a4;
  value_type *local_8a0;
  undefined4 **local_898;
  undefined4 local_890;
  undefined4 local_88c;
  value_type *local_888;
  undefined4 **local_880;
  undefined4 local_878;
  undefined4 local_874;
  value_type *local_870;
  undefined4 **local_868;
  undefined4 local_860;
  undefined4 local_85c;
  value_type *local_858;
  undefined4 **local_850;
  int local_7b8;
  undefined4 local_7b4;
  value_type *local_7b0;
  int local_7a8;
  undefined4 local_7a4;
  value_type *local_7a0;
  int local_798;
  undefined4 local_794;
  reference local_790;
  int local_788;
  undefined4 local_784;
  reference local_780;
  int local_768;
  undefined4 local_764;
  value_type *local_760;
  int local_748;
  undefined4 local_744;
  value_type *local_740;
  int local_728;
  undefined4 local_724;
  Mat *local_720;
  int local_708;
  undefined4 local_704;
  void **local_700;
  int local_6e8;
  undefined4 local_6e4;
  undefined4 **local_6e0;
  int local_6c8;
  undefined4 local_6c4;
  undefined4 **local_6c0;
  int local_6a8;
  undefined4 local_6a4;
  undefined4 **local_6a0;
  int local_688;
  undefined4 local_684;
  undefined4 **local_680;
  int local_668;
  undefined4 local_664;
  undefined1 *local_660;
  int local_648;
  undefined4 local_644;
  void **local_640;
  int local_628;
  undefined4 local_624;
  void **local_620;
  int local_608;
  undefined4 local_604;
  void **local_600;
  int local_5e8;
  undefined4 local_5e4;
  void **local_5e0;
  int local_5c8;
  undefined4 local_5c4;
  void **local_5c0;
  int local_5a8;
  undefined4 local_5a4;
  Mat *local_5a0;
  int local_588;
  undefined4 local_584;
  void **local_580;
  int local_568;
  undefined4 local_564;
  void **local_560;
  int local_548;
  undefined4 local_544;
  Mat *local_540;
  int local_528;
  undefined4 local_524;
  Mat *local_520;
  void *local_4f8;
  void *local_4e8;
  void *local_4d8;
  void *local_4c8;
  void *local_4b8;
  void *local_4a8;
  void *local_498;
  void *local_488;
  undefined4 *local_468;
  undefined4 *local_458;
  undefined4 *local_448;
  undefined4 *local_438;
  void *local_428;
  void *local_418;
  undefined4 *local_408;
  undefined4 *local_3f8;
  void *local_3e8;
  void *local_3e0;
  undefined4 *local_3d8;
  undefined4 *local_3d0;
  value_type *local_380;
  value_type *local_378;
  value_type *local_370;
  value_type *local_368;
  reference local_360;
  Mat *local_358;
  void **local_350;
  Allocator *local_348;
  int local_33c;
  ulong local_338;
  void *local_330;
  int local_324;
  int local_320;
  int local_31c;
  Mat *local_318;
  long *local_310;
  undefined4 local_304;
  ulong local_300;
  void *local_2f8;
  undefined4 local_2ec;
  int local_2e8;
  int local_2e4;
  void **local_2e0;
  long *local_2d8;
  undefined4 local_2cc;
  ulong local_2c8;
  void *local_2c0;
  undefined4 local_2b4;
  int local_2b0;
  int local_2ac;
  void **local_2a8;
  long *local_2a0;
  undefined4 local_294;
  ulong local_290;
  void *local_288;
  undefined4 local_27c;
  int local_278;
  int local_274;
  void **local_270;
  long *local_268;
  undefined4 local_25c;
  ulong local_258;
  void *local_250;
  undefined4 local_244;
  int local_240;
  int local_23c;
  void **local_238;
  long *local_230;
  undefined4 local_224;
  ulong local_220;
  void *local_218;
  undefined4 local_20c;
  int local_208;
  int local_204;
  void **local_200;
  long *local_1f8;
  undefined4 local_1ec;
  Option *local_1e8;
  Mat *local_1e0;
  undefined4 local_1d4;
  int local_1d0;
  int local_1cc;
  undefined1 *local_1c8;
  long *local_1c0;
  undefined4 local_1b4;
  ulong local_1b0;
  void *local_1a8;
  undefined4 local_19c;
  int local_198;
  int local_194;
  void **local_190;
  long *local_188;
  undefined4 local_17c;
  ulong local_178;
  void *local_170;
  undefined4 local_164;
  int local_160;
  int local_15c;
  void **local_158;
  undefined4 local_14c;
  long local_148;
  undefined4 local_13c;
  long local_138;
  undefined4 local_12c;
  long local_128;
  undefined4 local_11c;
  long local_118;
  undefined4 local_10c;
  long local_108;
  undefined4 local_fc;
  long local_f8;
  undefined4 local_ec;
  long local_e8;
  undefined4 local_dc;
  long local_d8;
  undefined4 local_cc;
  long local_c8;
  Allocator *local_c0;
  int local_b4;
  size_t local_b0;
  undefined4 *local_a8;
  undefined4 local_a0;
  int local_9c;
  undefined4 **local_98;
  Allocator *local_90;
  int local_84;
  size_t local_80;
  undefined4 *local_78;
  undefined4 local_70;
  int local_6c;
  undefined4 **local_68;
  Allocator *local_60;
  int local_54;
  size_t local_50;
  undefined4 *local_48;
  undefined4 local_40;
  int local_3c;
  undefined4 **local_38;
  Allocator *local_30;
  int local_24;
  size_t local_20;
  undefined4 *local_18;
  undefined4 local_10;
  int local_c;
  undefined4 **local_8;
  
  local_c88 = in_RCX;
  local_c80 = in_RDX;
  local_c78 = in_RSI;
  local_c90 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  local_c94 = local_c90->h;
  piVar6 = (int *)0x2;
  local_c98 = 1;
  if (*(int *)(in_RDI + 0xd8) == 2) {
    local_c98 = 2;
  }
  local_c60 = &local_ce0;
  local_ce0.data = (undefined4 *)0x0;
  local_ce0.refcount = (int *)0x0;
  local_ce0.elemsize = 0;
  local_ce0.elempack = 0;
  local_ce0.allocator = (Allocator *)0x0;
  local_ce0.dims = 0;
  local_ce0.w = 0;
  local_ce0.h = 0;
  local_ce0.d = 0;
  local_ce0.c = 0;
  local_ce0.cstep = 0;
  local_c58 = &local_d28;
  local_d28.data = (undefined4 *)0x0;
  local_d28.refcount = (int *)0x0;
  local_d28.elemsize = 0;
  local_d28.elempack = 0;
  local_d28.allocator = (Allocator *)0x0;
  local_d28.dims = 0;
  local_d28.w = 0;
  local_d28.h = 0;
  local_d28.d = 0;
  local_d28.c = 0;
  local_d28.cstep = 0;
  sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_c80);
  if (sVar3 == 3) {
    local_1270 = local_c88[1]._vptr_Allocator;
  }
  else {
    local_1270 = local_c88[2]._vptr_Allocator;
  }
  local_d40 = local_1270;
  sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_c78);
  if (sVar3 == 3) {
    pvVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_c78,1);
    Mat::clone(&local_d88,(__fn *)pvVar4,local_d40,(int)piVar6,in_R8);
    local_ab8 = &local_d88;
    local_ab0 = &local_ce0;
    if (&local_ce0 != local_ab8) {
      if (local_d88.refcount != (int *)0x0) {
        local_abc = 1;
        LOCK();
        local_ac0 = *local_d88.refcount;
        *local_d88.refcount = *local_d88.refcount + 1;
        UNLOCK();
      }
      local_7b0 = &local_ce0;
      if (local_ce0.refcount != (int *)0x0) {
        local_7b4 = 0xffffffff;
        LOCK();
        local_7b8 = *local_ce0.refcount;
        *local_ce0.refcount = *local_ce0.refcount + -1;
        UNLOCK();
        if (local_7b8 == 1) {
          if (local_ce0.allocator == (Allocator *)0x0) {
            local_3d0 = (undefined4 *)local_ce0.data;
            if ((undefined4 *)local_ce0.data != (undefined4 *)0x0) {
              free(local_ce0.data);
            }
          }
          else {
            (*(local_ce0.allocator)->_vptr_Allocator[3])(local_ce0.allocator,local_ce0.data);
          }
        }
      }
      local_ce0.data = (void *)0x0;
      local_ce0.elemsize = 0;
      local_ce0.elempack = 0;
      local_ce0.dims = 0;
      local_ce0.w = 0;
      local_ce0.h = 0;
      local_ce0.d = 0;
      local_ce0.c = 0;
      local_ce0.cstep = 0;
      local_ce0.refcount = (int *)0x0;
      local_ce0.data = local_ab8->data;
      local_ce0.refcount = local_ab8->refcount;
      local_ce0.elemsize = local_ab8->elemsize;
      local_ce0.elempack = local_ab8->elempack;
      local_ce0.allocator = local_ab8->allocator;
      local_ce0.dims = local_ab8->dims;
      local_ce0.w = local_ab8->w;
      local_ce0.h = local_ab8->h;
      local_ce0.d = local_ab8->d;
      local_ce0.c = local_ab8->c;
      piVar6 = (int *)local_ab8->cstep;
      local_ce0.cstep = (size_t)piVar6;
    }
    local_c50 = &local_d88;
    local_aa8 = &local_ce0;
    local_520 = local_c50;
    if (local_d88.refcount != (int *)0x0) {
      local_524 = 0xffffffff;
      LOCK();
      local_528 = *local_d88.refcount;
      *local_d88.refcount = *local_d88.refcount + -1;
      UNLOCK();
      piVar6 = local_d88.refcount;
      if (local_528 == 1) {
        if (local_d88.allocator == (Allocator *)0x0) {
          if (local_d88.data != (void *)0x0) {
            free(local_d88.data);
            piVar6 = local_d88.refcount;
          }
        }
        else {
          (*(local_d88.allocator)->_vptr_Allocator[3])(local_d88.allocator,local_d88.data);
          piVar6 = local_d88.refcount;
        }
      }
    }
    iVar2 = (int)piVar6;
    local_d88.data = (void *)0x0;
    local_d88.elemsize = 0;
    local_d88.elempack = 0;
    local_d88.dims = 0;
    local_d88.w = 0;
    local_d88.h = 0;
    local_d88.d = 0;
    local_d88.c = 0;
    local_d88.cstep = 0;
    local_d88.refcount = (int *)0x0;
    pvVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_c78,2);
    Mat::clone(&local_dd0,(__fn *)pvVar4,local_d40,iVar2,in_R8);
    local_ad8 = &local_dd0;
    local_ad0 = &local_d28;
    if (&local_d28 != local_ad8) {
      if (local_dd0.refcount != (int *)0x0) {
        local_adc = 1;
        LOCK();
        local_ae0 = *local_dd0.refcount;
        *local_dd0.refcount = *local_dd0.refcount + 1;
        UNLOCK();
      }
      local_7a0 = &local_d28;
      if (local_d28.refcount != (int *)0x0) {
        local_7a4 = 0xffffffff;
        LOCK();
        local_7a8 = *local_d28.refcount;
        *local_d28.refcount = *local_d28.refcount + -1;
        UNLOCK();
        if (local_7a8 == 1) {
          if (local_d28.allocator == (Allocator *)0x0) {
            local_3d8 = (undefined4 *)local_d28.data;
            if ((undefined4 *)local_d28.data != (undefined4 *)0x0) {
              free(local_d28.data);
            }
          }
          else {
            (*(local_d28.allocator)->_vptr_Allocator[3])(local_d28.allocator,local_d28.data);
          }
        }
      }
      local_d28.data = (void *)0x0;
      local_d28.elemsize = 0;
      local_d28.elempack = 0;
      local_d28.dims = 0;
      local_d28.w = 0;
      local_d28.h = 0;
      local_d28.d = 0;
      local_d28.c = 0;
      local_d28.cstep = 0;
      local_d28.refcount = (int *)0x0;
      local_d28.data = local_ad8->data;
      local_d28.refcount = local_ad8->refcount;
      local_d28.elemsize = local_ad8->elemsize;
      local_d28.elempack = local_ad8->elempack;
      local_d28.allocator = local_ad8->allocator;
      local_d28.dims = local_ad8->dims;
      local_d28.w = local_ad8->w;
      local_d28.h = local_ad8->h;
      local_d28.d = local_ad8->d;
      local_d28.c = local_ad8->c;
      local_d28.cstep = local_ad8->cstep;
    }
    local_c40 = &local_dd0;
    local_ac8 = &local_d28;
    local_540 = local_c40;
    if (local_dd0.refcount != (int *)0x0) {
      local_544 = 0xffffffff;
      LOCK();
      local_548 = *local_dd0.refcount;
      *local_dd0.refcount = *local_dd0.refcount + -1;
      UNLOCK();
      if (local_548 == 1) {
        if (local_dd0.allocator == (Allocator *)0x0) {
          if (local_dd0.data != (void *)0x0) {
            free(local_dd0.data);
          }
        }
        else {
          (*(local_dd0.allocator)->_vptr_Allocator[3])(local_dd0.allocator,local_dd0.data);
        }
      }
    }
    local_dd0.data = (void *)0x0;
    local_dd0.elemsize = 0;
    local_dd0.elempack = 0;
    local_dd0.dims = 0;
    local_dd0.w = 0;
    local_dd0.h = 0;
    local_dd0.d = 0;
    local_dd0.c = 0;
    local_dd0.cstep = 0;
    local_dd0.refcount = (int *)0x0;
  }
  else {
    Mat::create(in_stack_ffffffffffffea60,in_stack_ffffffffffffea5c,in_stack_ffffffffffffea58,
                in_stack_ffffffffffffea50,in_stack_ffffffffffffea48);
    local_a80 = &local_ce0;
    if ((undefined4 *)local_ce0.data != (undefined4 *)0x0) {
      local_370 = local_a80;
    }
    local_12b1 = (undefined4 *)local_ce0.data == (undefined4 *)0x0 ||
                 local_ce0.cstep * (long)local_ce0.c == 0;
    if (local_12b1) {
      local_c64 = -100;
      local_dd4 = 1;
      goto LAB_012b6207;
    }
    local_a40 = &local_ce0;
    local_a44 = 0;
    local_a48 = (int)local_ce0.cstep * local_ce0.c;
    local_a50 = (undefined4 *)local_ce0.data;
    for (local_a54 = 0; local_a54 < local_a48; local_a54 = local_a54 + 1) {
      *local_a50 = 0;
      local_a50 = local_a50 + 1;
    }
    local_380 = local_a40;
    Mat::create(in_stack_ffffffffffffea60,in_stack_ffffffffffffea5c,in_stack_ffffffffffffea58,
                in_stack_ffffffffffffea50,in_stack_ffffffffffffea48);
    local_a88 = &local_d28;
    if ((undefined4 *)local_d28.data != (undefined4 *)0x0) {
      local_368 = local_a88;
    }
    local_12c2 = (undefined4 *)local_d28.data == (undefined4 *)0x0 ||
                 local_d28.cstep * (long)local_d28.c == 0;
    if (local_12c2) {
      local_c64 = -100;
      local_dd4 = 1;
      goto LAB_012b6207;
    }
    local_a60 = &local_d28;
    local_a64 = 0;
    local_a68 = (int)local_d28.cstep * local_d28.c;
    local_a70 = (undefined4 *)local_d28.data;
    for (local_a74 = 0; local_378 = local_a60, local_a74 < local_a68; local_a74 = local_a74 + 1) {
      *local_a70 = 0;
      local_a70 = local_a70 + 1;
    }
  }
  local_de0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_c80,0);
  Mat::create(in_stack_ffffffffffffea60,in_stack_ffffffffffffea5c,in_stack_ffffffffffffea58,
              in_stack_ffffffffffffea50,in_stack_ffffffffffffea48);
  local_a90 = local_de0;
  bVar7 = true;
  if (local_de0->data != (void *)0x0) {
    local_360 = local_de0;
    bVar7 = local_de0->cstep * (long)local_de0->c == 0;
  }
  if (bVar7) {
    local_c64 = -100;
    local_dd4 = 1;
  }
  else {
    if ((*(int *)(in_RDI + 0xd8) == 0) || (*(int *)(in_RDI + 0xd8) == 1)) {
      local_930 = (undefined8 *)(in_RDI + 0x128);
      local_928 = &local_e30;
      local_31c = *(int *)(in_RDI + 0x154);
      local_320 = *(int *)(in_RDI + 0x158);
      local_324 = *(int *)(in_RDI + 0x15c);
      local_330 = (void *)*local_930;
      local_338 = *(ulong *)(in_RDI + 0x138);
      local_33c = *(int *)(in_RDI + 0x140);
      local_348 = *(Allocator **)(in_RDI + 0x148);
      local_318 = &local_e30;
      local_e30.refcount = (int *)0x0;
      local_e30.d = 1;
      local_c8 = (long)local_31c * (long)local_320 * local_338;
      local_e30.cstep = (local_c8 + 0xfU & 0xfffffffffffffff0) / local_338;
      local_e30.dims = *(int *)(in_RDI + 0x150) + -1;
      if (*(int *)(in_RDI + 0x150) == 4) {
        local_e30.cstep = (long)*(int *)(in_RDI + 0x154) * (long)*(int *)(in_RDI + 0x158);
      }
      local_950 = (undefined8 *)(in_RDI + 0x170);
      local_948 = &local_e78;
      local_2e4 = *(int *)(in_RDI + 0x19c);
      local_2e8 = *(int *)(in_RDI + 0x1a0);
      local_2ec = *(undefined4 *)(in_RDI + 0x1a4);
      local_2f8 = (void *)*local_950;
      local_300 = *(ulong *)(in_RDI + 0x180);
      local_304 = *(undefined4 *)(in_RDI + 0x188);
      local_310 = *(long **)(in_RDI + 400);
      local_2e0 = &local_e78;
      local_e70 = (int *)0x0;
      local_e44 = 1;
      local_d8 = (long)local_2e4 * (long)local_2e8 * local_300;
      local_e38 = (local_d8 + 0xfU & 0xfffffffffffffff0) / local_300;
      local_e50 = *(int *)(in_RDI + 0x198) + -1;
      if (*(int *)(in_RDI + 0x198) == 4) {
        local_e38 = (long)*(int *)(in_RDI + 0x19c) * (long)*(int *)(in_RDI + 0x1a0);
      }
      local_970 = (undefined8 *)(in_RDI + 0xe0);
      local_968 = &local_ec0;
      local_2ac = *(int *)(in_RDI + 0x10c);
      local_2b0 = *(int *)(in_RDI + 0x110);
      local_2b4 = *(undefined4 *)(in_RDI + 0x114);
      local_2c0 = (void *)*local_970;
      local_2c8 = *(ulong *)(in_RDI + 0xf0);
      local_2cc = *(undefined4 *)(in_RDI + 0xf8);
      local_2d8 = *(long **)(in_RDI + 0x100);
      local_2a8 = &local_ec0;
      local_eb8 = (int *)0x0;
      local_e8c = 1;
      local_e8 = (long)local_2ac * (long)local_2b0 * local_2c8;
      local_e80 = (local_e8 + 0xfU & 0xfffffffffffffff0) / local_2c8;
      local_e98 = *(int *)(in_RDI + 0x108) + -1;
      if (*(int *)(in_RDI + 0x108) == 4) {
        local_e80 = (long)*(int *)(in_RDI + 0x10c) * (long)*(int *)(in_RDI + 0x110);
      }
      local_cc = 0x10;
      local_dc = 0x10;
      local_ec = 0x10;
      local_934 = 0;
      local_935 = 1;
      local_954 = 0;
      local_955 = 1;
      local_974 = 0;
      local_975 = 1;
      in_stack_ffffffffffffea48 = local_c88;
      local_ec0 = local_2c0;
      local_eb0 = local_2c8;
      local_ea8 = local_2cc;
      local_ea0 = local_2d8;
      local_e94 = local_2ac;
      local_e90 = local_2b0;
      local_e88 = local_2b4;
      local_e78 = local_2f8;
      local_e68 = local_300;
      local_e60 = local_304;
      local_e58 = local_310;
      local_e4c = local_2e4;
      local_e48 = local_2e8;
      local_e40 = local_2ec;
      local_e30.data = local_330;
      local_e30.elemsize = local_338;
      local_e30.elempack = local_33c;
      local_e30.allocator = local_348;
      local_e30.w = local_31c;
      local_e30.h = local_320;
      local_e30.c = local_324;
      iVar2 = lstm(in_stack_ffffffffffffec98,in_stack_ffffffffffffec90,in_stack_ffffffffffffec8c,
                   in_stack_ffffffffffffec80,in_stack_ffffffffffffec78,
                   (Mat *)CONCAT17(in_stack_ffffffffffffec77,in_stack_ffffffffffffec70),
                   in_stack_ffffffffffffee60,in_stack_ffffffffffffee68,in_stack_ffffffffffffee70);
      local_c30 = &local_ec0;
      local_560 = local_c30;
      if (local_eb8 != (int *)0x0) {
        local_564 = 0xffffffff;
        LOCK();
        local_568 = *local_eb8;
        *local_eb8 = *local_eb8 + -1;
        UNLOCK();
        if (local_568 == 1) {
          if (local_ea0 == (long *)0x0) {
            local_4f8 = local_ec0;
            if (local_ec0 != (void *)0x0) {
              free(local_ec0);
            }
          }
          else {
            (**(code **)(*local_ea0 + 0x18))(local_ea0,local_ec0);
          }
        }
      }
      local_ec0 = (void *)0x0;
      local_eb0 = 0;
      local_ea8 = 0;
      local_e98 = 0;
      local_e94 = 0;
      local_e90 = 0;
      local_e8c = 0;
      local_e88 = 0;
      local_e80 = 0;
      local_eb8 = (int *)0x0;
      local_c20 = &local_e78;
      local_580 = local_c20;
      if (local_e70 != (int *)0x0) {
        local_584 = 0xffffffff;
        LOCK();
        local_588 = *local_e70;
        *local_e70 = *local_e70 + -1;
        UNLOCK();
        if (local_588 == 1) {
          if (local_e58 == (long *)0x0) {
            local_4e8 = local_e78;
            if (local_e78 != (void *)0x0) {
              free(local_e78);
            }
          }
          else {
            (**(code **)(*local_e58 + 0x18))(local_e58,local_e78);
          }
        }
      }
      local_e78 = (void *)0x0;
      local_e68 = 0;
      local_e60 = 0;
      local_e50 = 0;
      local_e4c = 0;
      local_e48 = 0;
      local_e44 = 0;
      local_e40 = 0;
      local_e38 = 0;
      local_e70 = (int *)0x0;
      in_stack_ffffffffffffec98 = &local_e30;
      local_c10 = in_stack_ffffffffffffec98;
      local_5a0 = in_stack_ffffffffffffec98;
      if (local_e30.refcount != (int *)0x0) {
        local_5a4 = 0xffffffff;
        LOCK();
        local_5a8 = *local_e30.refcount;
        *local_e30.refcount = *local_e30.refcount + -1;
        UNLOCK();
        if (local_5a8 == 1) {
          if (local_e30.allocator == (Allocator *)0x0) {
            local_4d8 = local_e30.data;
            if (local_e30.data != (void *)0x0) {
              free(local_e30.data);
            }
          }
          else {
            (*(local_e30.allocator)->_vptr_Allocator[3])(local_e30.allocator,local_e30.data);
          }
        }
      }
      in_stack_ffffffffffffec98->data = (void *)0x0;
      in_stack_ffffffffffffec98->elemsize = 0;
      in_stack_ffffffffffffec98->elempack = 0;
      in_stack_ffffffffffffec98->dims = 0;
      in_stack_ffffffffffffec98->w = 0;
      in_stack_ffffffffffffec98->h = 0;
      in_stack_ffffffffffffec98->d = 0;
      in_stack_ffffffffffffec98->c = 0;
      in_stack_ffffffffffffec98->cstep = 0;
      in_stack_ffffffffffffec98->refcount = (int *)0x0;
      local_de4 = iVar2;
      if (iVar2 != 0) {
        local_dd4 = 1;
        local_c64 = iVar2;
        goto LAB_012b6207;
      }
    }
    if (*(int *)(in_RDI + 0xd8) == 2) {
      local_904 = *(undefined4 *)(in_RDI + 0xd0);
      local_918 = local_c88[2]._vptr_Allocator;
      bias_c = &local_f08;
      local_908 = local_c94;
      local_910 = 4;
      local_f08.data = (void *)0x0;
      local_f08.refcount = (int *)0x0;
      local_f08.elemsize = 0;
      local_f08.elempack = 0;
      local_f08.allocator = (Allocator *)0x0;
      local_f08.dims = 0;
      local_f08.w = 0;
      local_f08.h = 0;
      local_f08.d = 0;
      local_f08.c = 0;
      local_f08.cstep = 0;
      local_900 = bias_c;
      Mat::create(in_stack_ffffffffffffea60,in_stack_ffffffffffffea5c,in_stack_ffffffffffffea58,
                  in_stack_ffffffffffffea50,in_stack_ffffffffffffea48);
      local_a98 = &local_f08;
      if (local_f08.data != (void *)0x0) {
        local_358 = local_a98;
      }
      uVar8 = local_f08.data == (void *)0x0 || local_f08.cstep * (long)local_f08.c == 0;
      if ((bool)uVar8) {
        local_c64 = -100;
        local_dd4 = 1;
      }
      else {
        local_8e4 = *(undefined4 *)(in_RDI + 0xd0);
        local_8f8 = local_c88[2]._vptr_Allocator;
        local_8e0 = &local_f50;
        local_8e8 = local_c94;
        local_8f0 = 4;
        local_f50 = (void *)0x0;
        local_f48 = (int *)0x0;
        local_f40 = 0;
        local_f38 = 0;
        local_f30 = (long *)0x0;
        local_f28 = 0;
        local_f24 = 0;
        local_f20 = 0;
        local_f1c = 0;
        local_f18 = 0;
        local_f10 = 0;
        Mat::create(in_stack_ffffffffffffea60,in_stack_ffffffffffffea5c,in_stack_ffffffffffffea58,
                    in_stack_ffffffffffffea50,in_stack_ffffffffffffea48);
        local_aa0 = &local_f50;
        if (local_f50 != (void *)0x0) {
          local_350 = local_aa0;
        }
        local_13a9 = local_f50 != (void *)0x0 && local_f10 * local_f18 != 0;
        if (local_13a9) {
          local_850 = &local_f98;
          local_858 = &local_ce0;
          local_98 = &local_f98;
          local_f98 = (undefined4 *)local_ce0.data;
          local_f90 = (int *)0x0;
          local_f88 = local_ce0.elemsize;
          local_f80 = local_ce0.elempack;
          local_f78 = local_ce0.allocator;
          local_f70 = 2;
          local_f6c = local_ce0.w;
          local_f68 = 1;
          local_f64 = 1;
          local_f60 = 1;
          local_f58 = (long)local_ce0.w;
          local_868 = &local_fe0;
          local_870 = &local_d28;
          local_68 = &local_fe0;
          local_fe0 = (undefined4 *)local_d28.data;
          local_fd8 = (int *)0x0;
          local_fd0 = local_d28.elemsize;
          local_fc8 = local_d28.elempack;
          local_fc0 = local_d28.allocator;
          local_fb8 = 2;
          local_fb4 = local_d28.w;
          local_fb0 = 1;
          local_fac = 1;
          local_fa8 = 1;
          local_fa0 = (long)local_d28.w;
          local_990 = (undefined8 *)(in_RDI + 0x128);
          local_988 = &local_1030;
          local_274 = *(int *)(in_RDI + 0x154);
          local_278 = *(int *)(in_RDI + 0x158);
          local_27c = *(undefined4 *)(in_RDI + 0x15c);
          local_288 = (void *)*local_990;
          local_290 = *(ulong *)(in_RDI + 0x138);
          local_294 = *(undefined4 *)(in_RDI + 0x140);
          local_2a0 = *(long **)(in_RDI + 0x148);
          local_270 = &local_1030;
          local_1028 = (int *)0x0;
          local_ffc = 1;
          local_f8 = (long)local_274 * (long)local_278 * local_290;
          local_ff0 = (local_f8 + 0xfU & 0xfffffffffffffff0) / local_290;
          local_1008 = *(int *)(in_RDI + 0x150) + -1;
          if (*(int *)(in_RDI + 0x150) == 4) {
            local_ff0 = (long)*(int *)(in_RDI + 0x154) * (long)*(int *)(in_RDI + 0x158);
          }
          local_9b0 = (undefined8 *)(in_RDI + 0x170);
          local_9a8 = &local_1078;
          local_23c = *(int *)(in_RDI + 0x19c);
          local_240 = *(int *)(in_RDI + 0x1a0);
          local_244 = *(undefined4 *)(in_RDI + 0x1a4);
          local_250 = (void *)*local_9b0;
          local_258 = *(ulong *)(in_RDI + 0x180);
          local_25c = *(undefined4 *)(in_RDI + 0x188);
          local_268 = *(long **)(in_RDI + 400);
          local_238 = &local_1078;
          local_1070 = (int *)0x0;
          local_1044 = 1;
          local_108 = (long)local_23c * (long)local_240 * local_258;
          local_1038 = (local_108 + 0xfU & 0xfffffffffffffff0) / local_258;
          local_1050 = *(int *)(in_RDI + 0x198) + -1;
          if (*(int *)(in_RDI + 0x198) == 4) {
            local_1038 = (long)*(int *)(in_RDI + 0x19c) * (long)*(int *)(in_RDI + 0x1a0);
          }
          local_9d0 = (undefined8 *)(in_RDI + 0xe0);
          local_9c8 = &local_10c0;
          local_204 = *(int *)(in_RDI + 0x10c);
          local_208 = *(int *)(in_RDI + 0x110);
          local_20c = *(undefined4 *)(in_RDI + 0x114);
          local_218 = (void *)*local_9d0;
          local_220 = *(ulong *)(in_RDI + 0xf0);
          local_224 = *(undefined4 *)(in_RDI + 0xf8);
          local_230 = *(long **)(in_RDI + 0x100);
          local_200 = &local_10c0;
          local_10b8 = (int *)0x0;
          local_108c = 1;
          local_118 = (long)local_204 * (long)local_208 * local_220;
          local_1080 = (local_118 + 0xfU & 0xfffffffffffffff0) / local_220;
          local_1098 = *(int *)(in_RDI + 0x108) + -1;
          if (*(int *)(in_RDI + 0x108) == 4) {
            local_1080 = (long)*(int *)(in_RDI + 0x10c) * (long)*(int *)(in_RDI + 0x110);
          }
          local_6c = local_d28.w;
          local_70 = 1;
          local_78 = (undefined4 *)local_d28.data;
          local_80 = local_d28.elemsize;
          local_84 = local_d28.elempack;
          local_90 = local_d28.allocator;
          local_9c = local_ce0.w;
          local_a0 = 1;
          local_a8 = (undefined4 *)local_ce0.data;
          local_b0 = local_ce0.elemsize;
          local_b4 = local_ce0.elempack;
          local_c0 = local_ce0.allocator;
          local_fc = 0x10;
          local_10c = 0x10;
          local_11c = 0x10;
          local_85c = 0;
          local_860 = 1;
          local_874 = 0;
          local_878 = 1;
          local_994 = 0;
          local_995 = 1;
          local_9b4 = 0;
          local_9b5 = 1;
          local_9d4 = 0;
          local_9d5 = 1;
          local_10c0 = local_218;
          local_10b0 = local_220;
          local_10a8 = local_224;
          local_10a0 = local_230;
          local_1094 = local_204;
          local_1090 = local_208;
          local_1088 = local_20c;
          local_1078 = local_250;
          local_1068 = local_258;
          local_1060 = local_25c;
          local_1058 = local_268;
          local_104c = local_23c;
          local_1048 = local_240;
          local_1040 = local_244;
          local_1030 = local_288;
          local_1020 = local_290;
          local_1018 = local_294;
          local_1010 = local_2a0;
          local_1004 = local_274;
          local_1000 = local_278;
          local_ff8 = local_27c;
          iVar2 = lstm(in_stack_ffffffffffffec98,in_stack_ffffffffffffec90,in_stack_ffffffffffffec8c
                       ,in_stack_ffffffffffffec80,bias_c,
                       (Mat *)CONCAT17(uVar8,in_stack_ffffffffffffec70),in_stack_ffffffffffffee60,
                       in_stack_ffffffffffffee68,in_stack_ffffffffffffee70);
          local_c00 = &local_10c0;
          local_5c0 = local_c00;
          if (local_10b8 != (int *)0x0) {
            local_5c4 = 0xffffffff;
            LOCK();
            local_5c8 = *local_10b8;
            *local_10b8 = *local_10b8 + -1;
            UNLOCK();
            if (local_5c8 == 1) {
              if (local_10a0 == (long *)0x0) {
                local_4c8 = local_10c0;
                if (local_10c0 != (void *)0x0) {
                  free(local_10c0);
                }
              }
              else {
                (**(code **)(*local_10a0 + 0x18))(local_10a0,local_10c0);
              }
            }
          }
          local_10c0 = (void *)0x0;
          local_10b0 = 0;
          local_10a8 = 0;
          local_1098 = 0;
          local_1094 = 0;
          local_1090 = 0;
          local_108c = 0;
          local_1088 = 0;
          local_1080 = 0;
          local_10b8 = (int *)0x0;
          local_bf0 = &local_1078;
          local_5e0 = local_bf0;
          if (local_1070 != (int *)0x0) {
            local_5e4 = 0xffffffff;
            LOCK();
            local_5e8 = *local_1070;
            *local_1070 = *local_1070 + -1;
            UNLOCK();
            if (local_5e8 == 1) {
              if (local_1058 == (long *)0x0) {
                local_4b8 = local_1078;
                if (local_1078 != (void *)0x0) {
                  free(local_1078);
                }
              }
              else {
                (**(code **)(*local_1058 + 0x18))(local_1058,local_1078);
              }
            }
          }
          local_1078 = (void *)0x0;
          local_1068 = 0;
          local_1060 = 0;
          local_1050 = 0;
          local_104c = 0;
          local_1048 = 0;
          local_1044 = 0;
          local_1040 = 0;
          local_1038 = 0;
          local_1070 = (int *)0x0;
          local_be0 = &local_1030;
          local_600 = local_be0;
          if (local_1028 != (int *)0x0) {
            local_604 = 0xffffffff;
            LOCK();
            local_608 = *local_1028;
            *local_1028 = *local_1028 + -1;
            UNLOCK();
            if (local_608 == 1) {
              if (local_1010 == (long *)0x0) {
                local_4a8 = local_1030;
                if (local_1030 != (void *)0x0) {
                  free(local_1030);
                }
              }
              else {
                (**(code **)(*local_1010 + 0x18))(local_1010,local_1030);
              }
            }
          }
          local_1030 = (void *)0x0;
          local_1020 = 0;
          local_1018 = 0;
          local_1008 = 0;
          local_1004 = 0;
          local_1000 = 0;
          local_ffc = 0;
          local_ff8 = 0;
          local_ff0 = 0;
          local_1028 = (int *)0x0;
          local_fe4 = iVar2;
          if (iVar2 == 0) {
            local_880 = &local_1108;
            local_888 = &local_ce0;
            local_48 = (undefined4 *)((long)local_ce0.data + (long)local_ce0.w * local_ce0.elemsize)
            ;
            local_38 = &local_1108;
            local_1100 = (int *)0x0;
            local_10f8 = local_ce0.elemsize;
            local_10f0 = local_ce0.elempack;
            local_10e8 = local_ce0.allocator;
            local_10e0 = 2;
            local_10dc = local_ce0.w;
            local_10d8 = 1;
            local_10d4 = 1;
            local_10d0 = 1;
            local_10c8 = (long)local_ce0.w;
            local_898 = &local_1150;
            local_8a0 = &local_d28;
            local_18 = (undefined4 *)((long)local_d28.data + (long)local_d28.w * local_d28.elemsize)
            ;
            local_8 = &local_1150;
            local_1148 = (int *)0x0;
            local_1140 = local_d28.elemsize;
            local_1138 = local_d28.elempack;
            local_1130 = local_d28.allocator;
            local_1128 = 2;
            local_1124 = local_d28.w;
            local_1120 = 1;
            local_111c = 1;
            local_1118 = 1;
            local_1110 = (long)local_d28.w;
            local_9f0 = (long *)(in_RDI + 0x128);
            local_9e8 = &stack0xffffffffffffee60;
            local_1cc = *(int *)(in_RDI + 0x154);
            local_1d0 = *(int *)(in_RDI + 0x158);
            local_1d4 = *(undefined4 *)(in_RDI + 0x15c);
            hidden_state = (Mat *)(*local_9f0 +
                                  *(long *)(in_RDI + 0x168) * *(long *)(in_RDI + 0x138));
            local_1e8 = *(Option **)(in_RDI + 0x138);
            local_1ec = *(undefined4 *)(in_RDI + 0x140);
            plVar1 = *(long **)(in_RDI + 0x148);
            local_1c8 = &stack0xffffffffffffee60;
            local_128 = (long)local_1cc * (long)local_1d0 * (long)local_1e8;
            local_a10 = (long *)(in_RDI + 0x170);
            local_a08 = &local_11e8;
            local_194 = *(int *)(in_RDI + 0x19c);
            local_198 = *(int *)(in_RDI + 0x1a0);
            local_19c = *(undefined4 *)(in_RDI + 0x1a4);
            local_1a8 = (void *)(*local_a10 + *(long *)(in_RDI + 0x1b0) * *(long *)(in_RDI + 0x180))
            ;
            local_1b0 = *(ulong *)(in_RDI + 0x180);
            local_1b4 = *(undefined4 *)(in_RDI + 0x188);
            local_1c0 = *(long **)(in_RDI + 400);
            local_190 = &local_11e8;
            local_11e0 = (int *)0x0;
            local_11b4 = 1;
            local_138 = (long)local_194 * (long)local_198 * local_1b0;
            local_11a8 = (local_138 + 0xfU & 0xfffffffffffffff0) / local_1b0;
            local_11c0 = *(int *)(in_RDI + 0x198) + -1;
            if (*(int *)(in_RDI + 0x198) == 4) {
              local_11a8 = (long)*(int *)(in_RDI + 0x19c) * (long)*(int *)(in_RDI + 0x1a0);
            }
            local_a30 = (long *)(in_RDI + 0xe0);
            local_a28 = &local_1230;
            local_15c = *(int *)(in_RDI + 0x10c);
            local_160 = *(int *)(in_RDI + 0x110);
            local_164 = *(undefined4 *)(in_RDI + 0x114);
            local_170 = (void *)(*local_a30 + *(long *)(in_RDI + 0x120) * *(long *)(in_RDI + 0xf0));
            local_178 = *(ulong *)(in_RDI + 0xf0);
            local_17c = *(undefined4 *)(in_RDI + 0xf8);
            local_188 = *(long **)(in_RDI + 0x100);
            local_158 = &local_1230;
            local_1228 = (int *)0x0;
            local_11fc = 1;
            local_148 = (long)local_15c * (long)local_160 * local_178;
            local_11f0 = (local_148 + 0xfU & 0xfffffffffffffff0) / local_178;
            local_1208 = *(int *)(in_RDI + 0x108) + -1;
            if (*(int *)(in_RDI + 0x108) == 4) {
              local_11f0 = (long)*(int *)(in_RDI + 0x10c) * (long)*(int *)(in_RDI + 0x110);
            }
            local_c = local_d28.w;
            local_10 = 1;
            local_20 = local_d28.elemsize;
            local_24 = local_d28.elempack;
            local_30 = local_d28.allocator;
            local_3c = local_ce0.w;
            local_40 = 1;
            local_50 = local_ce0.elemsize;
            local_54 = local_ce0.elempack;
            local_60 = local_ce0.allocator;
            local_12c = 0x10;
            local_13c = 0x10;
            local_14c = 0x10;
            local_88c = 1;
            local_890 = 1;
            local_8a4 = 1;
            local_8a8 = 1;
            local_9f4 = 1;
            local_9f5 = 1;
            local_a14 = 1;
            local_a15 = 1;
            local_a34 = 1;
            local_a35 = 1;
            local_ff0 = 0;
            local_1008 = 0;
            piVar6 = (int *)0x0;
            local_1f8 = plVar1;
            local_1e0 = hidden_state;
            local_1230 = local_170;
            local_1220 = local_178;
            local_1218 = local_17c;
            local_1210 = local_188;
            local_1204 = local_15c;
            local_1200 = local_160;
            local_11f8 = local_164;
            local_11e8 = local_1a8;
            local_11d8 = local_1b0;
            local_11d0 = local_1b4;
            local_11c8 = local_1c0;
            local_11bc = local_194;
            local_11b8 = local_198;
            local_11b0 = local_19c;
            local_1150 = local_18;
            local_1108 = local_48;
            iVar2 = lstm(in_stack_ffffffffffffec98,in_stack_ffffffffffffec90,
                         in_stack_ffffffffffffec8c,in_stack_ffffffffffffec80,bias_c,
                         (Mat *)CONCAT17(uVar8,in_stack_ffffffffffffec70),hidden_state,(Mat *)0x0,
                         local_1e8);
            local_bd0 = &local_1230;
            local_620 = local_bd0;
            if (local_1228 != (int *)0x0) {
              local_624 = 0xffffffff;
              LOCK();
              local_628 = *local_1228;
              *local_1228 = *local_1228 + -1;
              UNLOCK();
              if (local_628 == 1) {
                if (local_1210 == (long *)0x0) {
                  local_498 = local_1230;
                  if (local_1230 != (void *)0x0) {
                    free(local_1230);
                  }
                }
                else {
                  (**(code **)(*local_1210 + 0x18))(local_1210,local_1230);
                }
              }
            }
            local_1230 = (void *)0x0;
            local_1220 = 0;
            local_1218 = 0;
            local_1208 = 0;
            local_1204 = 0;
            local_1200 = 0;
            local_11fc = 0;
            local_11f8 = 0;
            local_11f0 = 0;
            local_1228 = (int *)0x0;
            local_bc0 = &local_11e8;
            local_640 = local_bc0;
            if (local_11e0 != (int *)0x0) {
              local_644 = 0xffffffff;
              LOCK();
              local_648 = *local_11e0;
              *local_11e0 = *local_11e0 + -1;
              UNLOCK();
              if (local_648 == 1) {
                if (local_11c8 == (long *)0x0) {
                  local_488 = local_11e8;
                  if (local_11e8 != (void *)0x0) {
                    free(local_11e8);
                  }
                }
                else {
                  (**(code **)(*local_11c8 + 0x18))(local_11c8,local_11e8);
                }
              }
            }
            local_11e8 = (void *)0x0;
            local_11d8 = 0;
            local_11d0 = 0;
            local_11c0 = 0;
            local_11bc = 0;
            local_11b8 = 0;
            local_11b4 = 0;
            local_11b0 = 0;
            local_11a8 = 0;
            local_11e0 = (int *)0x0;
            local_bb0 = &stack0xffffffffffffee60;
            local_660 = local_bb0;
            if (piVar6 != (int *)0x0) {
              local_664 = 0xffffffff;
              LOCK();
              local_668 = *piVar6;
              *piVar6 = *piVar6 + -1;
              UNLOCK();
              if (local_668 == 1) {
                if (plVar1 == (long *)0x0) {
                  if (hidden_state != (Mat *)0x0) {
                    free(hidden_state);
                  }
                }
                else {
                  (**(code **)(*plVar1 + 0x18))(plVar1,hidden_state);
                }
              }
            }
            if (iVar2 == 0) {
              for (local_1234 = 0; local_1234 < local_c94; local_1234 = local_1234 + 1) {
                local_8b0 = &local_f08;
                local_8b4 = local_1234;
                local_8c0 = &local_f50;
                local_8c4 = local_1234;
                __src = (void *)((long)local_f50 + (long)local_f24 * (long)local_1234 * local_f40);
                local_8d0 = local_de0;
                local_8d4 = local_1234;
                __dest = (void *)((long)local_de0->data +
                                 (long)local_de0->w * (long)local_1234 * local_de0->elemsize);
                memcpy(__dest,(void *)((long)local_f08.data +
                                      (long)local_f08.w * (long)local_1234 * local_f08.elemsize),
                       (long)*(int *)(in_RDI + 0xd0) << 2);
                memcpy((void *)((long)__dest + (long)*(int *)(in_RDI + 0xd0) * 4),__src,
                       (long)*(int *)(in_RDI + 0xd0) << 2);
              }
              local_dd4 = 0;
            }
            else {
              local_dd4 = 1;
              local_c64 = iVar2;
            }
            local_ba0 = &local_1150;
            local_680 = local_ba0;
            if (local_1148 != (int *)0x0) {
              local_684 = 0xffffffff;
              LOCK();
              local_688 = *local_1148;
              *local_1148 = *local_1148 + -1;
              UNLOCK();
              if (local_688 == 1) {
                if (local_1130 == (Allocator *)0x0) {
                  local_468 = local_1150;
                  if (local_1150 != (undefined4 *)0x0) {
                    free(local_1150);
                  }
                }
                else {
                  (*local_1130->_vptr_Allocator[3])(local_1130,local_1150);
                }
              }
            }
            local_1150 = (undefined4 *)0x0;
            local_1140 = 0;
            local_1138 = 0;
            local_1128 = 0;
            local_1124 = 0;
            local_1120 = 0;
            local_111c = 0;
            local_1118 = 0;
            local_1110 = 0;
            local_1148 = (int *)0x0;
            local_b90 = &local_1108;
            local_6a0 = local_b90;
            if (local_1100 != (int *)0x0) {
              local_6a4 = 0xffffffff;
              LOCK();
              local_6a8 = *local_1100;
              *local_1100 = *local_1100 + -1;
              UNLOCK();
              if (local_6a8 == 1) {
                if (local_10e8 == (Allocator *)0x0) {
                  local_458 = local_1108;
                  if (local_1108 != (undefined4 *)0x0) {
                    free(local_1108);
                  }
                }
                else {
                  (*local_10e8->_vptr_Allocator[3])(local_10e8,local_1108);
                }
              }
            }
            local_1108 = (undefined4 *)0x0;
            local_10f8 = 0;
            local_10f0 = 0;
            local_10e0 = 0;
            local_10dc = 0;
            local_10d8 = 0;
            local_10d4 = 0;
            local_10d0 = 0;
            local_10c8 = 0;
            local_1100 = (int *)0x0;
          }
          else {
            local_dd4 = 1;
            local_c64 = iVar2;
          }
          local_b80 = &local_fe0;
          local_6c0 = local_b80;
          if (local_fd8 != (int *)0x0) {
            local_6c4 = 0xffffffff;
            LOCK();
            local_6c8 = *local_fd8;
            *local_fd8 = *local_fd8 + -1;
            UNLOCK();
            if (local_6c8 == 1) {
              if (local_fc0 == (Allocator *)0x0) {
                local_448 = local_fe0;
                if (local_fe0 != (undefined4 *)0x0) {
                  free(local_fe0);
                }
              }
              else {
                (*local_fc0->_vptr_Allocator[3])(local_fc0,local_fe0);
              }
            }
          }
          local_fe0 = (undefined4 *)0x0;
          local_fd0 = 0;
          local_fc8 = 0;
          local_fb8 = 0;
          local_fb4 = 0;
          local_fb0 = 0;
          local_fac = 0;
          local_fa8 = 0;
          local_fa0 = 0;
          local_fd8 = (int *)0x0;
          local_b70 = &local_f98;
          local_6e0 = local_b70;
          if (local_f90 != (int *)0x0) {
            local_6e4 = 0xffffffff;
            LOCK();
            local_6e8 = *local_f90;
            *local_f90 = *local_f90 + -1;
            UNLOCK();
            if (local_6e8 == 1) {
              if (local_f78 == (Allocator *)0x0) {
                local_438 = local_f98;
                if (local_f98 != (undefined4 *)0x0) {
                  free(local_f98);
                }
              }
              else {
                (*local_f78->_vptr_Allocator[3])(local_f78,local_f98);
              }
            }
          }
          local_f98 = (undefined4 *)0x0;
          local_f88 = 0;
          local_f80 = 0;
          local_f70 = 0;
          local_f6c = 0;
          local_f68 = 0;
          local_f64 = 0;
          local_f60 = 0;
          local_f58 = 0;
          local_f90 = (int *)0x0;
        }
        else {
          local_c64 = -100;
          local_dd4 = 1;
        }
        local_b60 = &local_f50;
        local_700 = local_b60;
        if (local_f48 != (int *)0x0) {
          local_704 = 0xffffffff;
          LOCK();
          local_708 = *local_f48;
          *local_f48 = *local_f48 + -1;
          UNLOCK();
          if (local_708 == 1) {
            if (local_f30 == (long *)0x0) {
              local_428 = local_f50;
              if (local_f50 != (void *)0x0) {
                free(local_f50);
              }
            }
            else {
              (**(code **)(*local_f30 + 0x18))(local_f30,local_f50);
            }
          }
        }
        local_f50 = (void *)0x0;
        local_f40 = 0;
        local_f38 = 0;
        local_f28 = 0;
        local_f24 = 0;
        local_f20 = 0;
        local_f1c = 0;
        local_f18 = 0;
        local_f10 = 0;
        local_f48 = (int *)0x0;
      }
      local_b50 = &local_f08;
      local_720 = local_b50;
      if (local_f08.refcount != (int *)0x0) {
        local_724 = 0xffffffff;
        LOCK();
        local_728 = *local_f08.refcount;
        *local_f08.refcount = *local_f08.refcount + -1;
        UNLOCK();
        if (local_728 == 1) {
          if (local_f08.allocator == (Allocator *)0x0) {
            local_418 = local_f08.data;
            if (local_f08.data != (void *)0x0) {
              free(local_f08.data);
            }
          }
          else {
            (*(local_f08.allocator)->_vptr_Allocator[3])(local_f08.allocator,local_f08.data);
          }
        }
      }
      local_f08.data = (void *)0x0;
      local_f08.elemsize = 0;
      local_f08.elempack = 0;
      local_f08.dims = 0;
      local_f08.w = 0;
      local_f08.h = 0;
      local_f08.d = 0;
      local_f08.c = 0;
      local_f08.cstep = 0;
      local_f08.refcount = (int *)0x0;
      if (local_dd4 != 0) goto LAB_012b6207;
    }
    sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_c80);
    if (sVar3 == 3) {
      pvVar5 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_c80,1);
      local_af8 = &local_ce0;
      local_af0 = pvVar5;
      if (pvVar5 != local_af8) {
        if (local_ce0.refcount != (int *)0x0) {
          local_afc = 1;
          LOCK();
          local_b00 = *local_ce0.refcount;
          *local_ce0.refcount = *local_ce0.refcount + 1;
          UNLOCK();
        }
        local_790 = pvVar5;
        if (pvVar5->refcount != (int *)0x0) {
          piVar6 = pvVar5->refcount;
          local_794 = 0xffffffff;
          LOCK();
          local_798 = *piVar6;
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (local_798 == 1) {
            if (pvVar5->allocator == (Allocator *)0x0) {
              local_3e0 = pvVar5->data;
              if (local_3e0 != (void *)0x0) {
                free(local_3e0);
              }
            }
            else {
              (*pvVar5->allocator->_vptr_Allocator[3])(pvVar5->allocator,pvVar5->data);
            }
          }
        }
        pvVar5->data = (void *)0x0;
        pvVar5->elemsize = 0;
        pvVar5->elempack = 0;
        pvVar5->dims = 0;
        pvVar5->w = 0;
        pvVar5->h = 0;
        pvVar5->d = 0;
        pvVar5->c = 0;
        pvVar5->cstep = 0;
        pvVar5->refcount = (int *)0x0;
        pvVar5->data = local_af8->data;
        pvVar5->refcount = local_af8->refcount;
        pvVar5->elemsize = local_af8->elemsize;
        pvVar5->elempack = local_af8->elempack;
        pvVar5->allocator = local_af8->allocator;
        pvVar5->dims = local_af8->dims;
        pvVar5->w = local_af8->w;
        pvVar5->h = local_af8->h;
        pvVar5->d = local_af8->d;
        pvVar5->c = local_af8->c;
        pvVar5->cstep = local_af8->cstep;
      }
      local_ae8 = pvVar5;
      pvVar5 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_c80,2);
      local_b18 = &local_d28;
      local_b10 = pvVar5;
      local_b08 = pvVar5;
      if (pvVar5 != local_b18) {
        if (local_d28.refcount != (int *)0x0) {
          local_b1c = 1;
          LOCK();
          local_b20 = *local_d28.refcount;
          *local_d28.refcount = *local_d28.refcount + 1;
          UNLOCK();
        }
        local_780 = pvVar5;
        if (pvVar5->refcount != (int *)0x0) {
          piVar6 = pvVar5->refcount;
          local_784 = 0xffffffff;
          LOCK();
          local_788 = *piVar6;
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (local_788 == 1) {
            if (pvVar5->allocator == (Allocator *)0x0) {
              local_3e8 = pvVar5->data;
              if (local_3e8 != (void *)0x0) {
                free(local_3e8);
              }
            }
            else {
              (*pvVar5->allocator->_vptr_Allocator[3])(pvVar5->allocator,pvVar5->data);
            }
          }
        }
        pvVar5->data = (void *)0x0;
        pvVar5->elemsize = 0;
        pvVar5->elempack = 0;
        pvVar5->dims = 0;
        pvVar5->w = 0;
        pvVar5->h = 0;
        pvVar5->d = 0;
        pvVar5->c = 0;
        pvVar5->cstep = 0;
        pvVar5->refcount = (int *)0x0;
        pvVar5->data = local_b18->data;
        pvVar5->refcount = local_b18->refcount;
        pvVar5->elemsize = local_b18->elemsize;
        pvVar5->elempack = local_b18->elempack;
        pvVar5->allocator = local_b18->allocator;
        pvVar5->dims = local_b18->dims;
        pvVar5->w = local_b18->w;
        pvVar5->h = local_b18->h;
        pvVar5->d = local_b18->d;
        pvVar5->c = local_b18->c;
        pvVar5->cstep = local_b18->cstep;
      }
    }
    local_c64 = 0;
    local_dd4 = 1;
  }
LAB_012b6207:
  local_b40 = &local_d28;
  local_740 = local_b40;
  if (local_d28.refcount != (int *)0x0) {
    local_744 = 0xffffffff;
    LOCK();
    local_748 = *local_d28.refcount;
    *local_d28.refcount = *local_d28.refcount + -1;
    UNLOCK();
    if (local_748 == 1) {
      if (local_d28.allocator == (Allocator *)0x0) {
        local_408 = (undefined4 *)local_d28.data;
        if ((undefined4 *)local_d28.data != (undefined4 *)0x0) {
          free(local_d28.data);
        }
      }
      else {
        (*(local_d28.allocator)->_vptr_Allocator[3])(local_d28.allocator,local_d28.data);
      }
    }
  }
  local_d28.data = (void *)0x0;
  local_d28.elemsize = 0;
  local_d28.elempack = 0;
  local_d28.dims = 0;
  local_d28.w = 0;
  local_d28.h = 0;
  local_d28.d = 0;
  local_d28.c = 0;
  local_d28.cstep = 0;
  local_d28.refcount = (int *)0x0;
  local_b30 = &local_ce0;
  if (local_ce0.refcount != (int *)0x0) {
    local_764 = 0xffffffff;
    LOCK();
    local_768 = *local_ce0.refcount;
    *local_ce0.refcount = *local_ce0.refcount + -1;
    UNLOCK();
    if (local_768 == 1) {
      local_760 = local_b30;
      if (local_ce0.allocator == (Allocator *)0x0) {
        local_3f8 = (undefined4 *)local_ce0.data;
        if ((undefined4 *)local_ce0.data != (undefined4 *)0x0) {
          free(local_ce0.data);
        }
      }
      else {
        (*(local_ce0.allocator)->_vptr_Allocator[3])(local_ce0.allocator,local_ce0.data);
      }
    }
  }
  return local_c64;
}

Assistant:

int LSTM::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int T = bottom_blob.h;
    int num_directions = direction == 2 ? 2 : 1;

    Mat hidden;
    Mat cell;
    Allocator* hidden_cell_allocator = top_blobs.size() == 3 ? opt.blob_allocator : opt.workspace_allocator;
    if (bottom_blobs.size() == 3)
    {
        hidden = bottom_blobs[1].clone(hidden_cell_allocator);
        cell = bottom_blobs[2].clone(hidden_cell_allocator);
    }
    else
    {
        hidden.create(num_output, num_directions, 4u, hidden_cell_allocator);
        if (hidden.empty())
            return -100;
        hidden.fill(0.f);

        cell.create(num_output, num_directions, 4u, hidden_cell_allocator);
        if (cell.empty())
            return -100;
        cell.fill(0.f);
    }

    Mat& top_blob = top_blobs[0];
    top_blob.create(num_output * num_directions, T, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // Uni directional
    if (direction == 0 || direction == 1)
    {
        int ret = lstm(bottom_blob, top_blob, direction, weight_xc_data.channel(0), bias_c_data.channel(0), weight_hc_data.channel(0), hidden, cell, opt);
        if (ret != 0)
            return ret;
    }

    if (direction == 2)
    {
        Mat top_blob_forward(num_output, T, 4u, opt.workspace_allocator);
        if (top_blob_forward.empty())
            return -100;

        Mat top_blob_reverse(num_output, T, 4u, opt.workspace_allocator);
        if (top_blob_reverse.empty())
            return -100;

        Mat hidden0 = hidden.row_range(0, 1);
        Mat cell0 = cell.row_range(0, 1);
        int ret0 = lstm(bottom_blob, top_blob_forward, 0, weight_xc_data.channel(0), bias_c_data.channel(0), weight_hc_data.channel(0), hidden0, cell0, opt);
        if (ret0 != 0)
            return ret0;

        Mat hidden1 = hidden.row_range(1, 1);
        Mat cell1 = cell.row_range(1, 1);
        int ret1 = lstm(bottom_blob, top_blob_reverse, 1, weight_xc_data.channel(1), bias_c_data.channel(1), weight_hc_data.channel(1), hidden1, cell1, opt);
        if (ret1 != 0)
            return ret1;

        // concat w
        for (int i = 0; i < T; i++)
        {
            const float* pf = top_blob_forward.row(i);
            const float* pr = top_blob_reverse.row(i);
            float* ptr = top_blob.row(i);

            memcpy(ptr, pf, num_output * sizeof(float));
            memcpy(ptr + num_output, pr, num_output * sizeof(float));
        }
    }

    if (top_blobs.size() == 3)
    {
        top_blobs[1] = hidden;
        top_blobs[2] = cell;
    }

    return 0;
}